

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadGroupNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  _func_int **pp_Var2;
  size_t sVar3;
  long *in_RDX;
  Node *in_RDI;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> group;
  Ref<embree::XML> *in_stack_000017d8;
  XMLLoader *in_stack_000017e0;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffee0;
  GroupNode *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef8;
  GroupNode *in_stack_ffffffffffffff00;
  long *local_a8;
  ulong local_a0;
  _func_int **local_88;
  long *local_80;
  long *local_68;
  long *local_60;
  long **local_58;
  _func_int **local_48;
  _func_int ***local_40;
  _func_int ***local_38;
  _func_int ***local_30;
  _func_int ***local_20;
  _func_int **local_10;
  
  local_80 = in_RDX;
  pp_Var2 = (_func_int **)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_40 = &local_88;
  local_48 = pp_Var2;
  local_88 = pp_Var2;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 0x10))();
  }
  local_a0 = 0;
  while( true ) {
    uVar1 = local_a0;
    local_60 = local_80;
    sVar3 = XML::size((XML *)0x3b9685);
    if (sVar3 <= uVar1) break;
    local_38 = &local_88;
    local_68 = local_80;
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (*local_80 + 0x80),local_a0);
    loadNode(in_stack_000017e0,in_stack_000017d8);
    SceneGraph::GroupNode::add(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_58 = &local_a8;
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 0x18))();
    }
    local_a0 = local_a0 + 1;
  }
  local_20 = &local_88;
  local_10 = local_88;
  (in_RDI->super_RefCount)._vptr_RefCount = local_88;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_30 = &local_88;
  if (local_88 != (_func_int **)0x0) {
    (**(code **)(*local_88 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadGroupNode(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=0; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));
    return group.cast<SceneGraph::Node>();
  }